

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Chipset.cpp
# Opt level: O0

void __thiscall Amiga::Chipset::update_interrupts(Chipset *this)

{
  ushort uVar1;
  uint16_t enabled_requests;
  Chipset *this_local;
  
  Audio::set_interrupt_requests(&this->audio_,this->interrupt_requests_);
  this->interrupt_level_ = 0;
  uVar1 = this->interrupt_enable_ & this->interrupt_requests_;
  if (((uVar1 & 0x3fff) != 0) && ((this->interrupt_enable_ & 0x4000) != 0)) {
    if ((uVar1 & 0x2000) == 0) {
      if ((uVar1 & 0x1800) == 0) {
        if ((uVar1 & 0x780) == 0) {
          if ((uVar1 & 0x70) == 0) {
            if ((uVar1 & 8) == 0) {
              if ((uVar1 & 7) != 0) {
                this->interrupt_level_ = 1;
              }
            }
            else {
              this->interrupt_level_ = 2;
            }
          }
          else {
            this->interrupt_level_ = 3;
          }
        }
        else {
          this->interrupt_level_ = 4;
        }
      }
      else {
        this->interrupt_level_ = 5;
      }
    }
    else {
      this->interrupt_level_ = 6;
    }
  }
  return;
}

Assistant:

void Chipset::update_interrupts() {
	audio_.set_interrupt_requests(interrupt_requests_);
	interrupt_level_ = 0;

	const uint16_t enabled_requests = interrupt_enable_ & interrupt_requests_ & 0x3fff;
	if(enabled_requests && (interrupt_enable_ & 0x4000)) {
		if(enabled_requests & InterruptFlag::External) {
			interrupt_level_ = 6;
		} else if(enabled_requests & (InterruptFlag::SerialPortReceive | InterruptFlag::DiskSyncMatch)) {
			interrupt_level_ = 5;
		} else if(enabled_requests & (InterruptFlag::AudioChannel0 | InterruptFlag::AudioChannel1 | InterruptFlag::AudioChannel2 | InterruptFlag::AudioChannel3)) {
			interrupt_level_ = 4;
		} else if(enabled_requests & (InterruptFlag::Copper | InterruptFlag::VerticalBlank | InterruptFlag::Blitter)) {
			interrupt_level_ = 3;
		} else if(enabled_requests & InterruptFlag::IOPortsAndTimers) {
			interrupt_level_ = 2;
		} else if(enabled_requests & (InterruptFlag::SerialPortTransmit | InterruptFlag::DiskBlock | InterruptFlag::Software)) {
			interrupt_level_ = 1;
		}
	}
}